

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O2

Aig_Man_t * Aig_ManStartFrom(Aig_Man_t *p)

{
  Aig_Man_t *p_00;
  char *pcVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  int i;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar1 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar1;
  pcVar1 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar1;
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  for (i = 0; i < p->vCis->nSize; i = i + 1) {
    pvVar2 = Vec_PtrEntry(p->vCis,i);
    pAVar3 = Aig_ObjCreateCi(p_00);
    *(ulong *)&pAVar3->field_0x18 =
         *(ulong *)&pAVar3->field_0x18 & 0xff000000ffffffff |
         *(ulong *)((long)pvVar2 + 0x18) & 0xffffff00000000;
    *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar3;
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManStartFrom( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew;
    int i;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
    {
        pObjNew = Aig_ObjCreateCi( pNew );
        pObjNew->Level = pObj->Level;
        pObj->pData = pObjNew;
    }
    return pNew;
}